

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O1

bool ON_MeshParameters_AreValid(void)

{
  Type TVar1;
  char *sFormat;
  bool bVar2;
  int line_number;
  double normalized_mesh_density;
  double dVar3;
  ON_MeshParameters mp;
  ON_MeshParameters local_f0;
  
  TVar1 = ON_MeshParameters::GeometrySettingsType(&ON_MeshParameters::DefaultMesh);
  if (TVar1 == Default) {
    TVar1 = ON_MeshParameters::GeometrySettingsType(&ON_MeshParameters::FastRenderMesh);
    if (TVar1 == FastRender) {
      TVar1 = ON_MeshParameters::GeometrySettingsType(&ON_MeshParameters::QualityRenderMesh);
      if (TVar1 == QualityRender) {
        TVar1 = ON_MeshParameters::GeometrySettingsType(&ON_MeshParameters::DefaultAnalysisMesh);
        if (TVar1 == DefaultAnalysis) {
          normalized_mesh_density = 0.0;
          bVar2 = false;
          while( true ) {
            ON_MeshParameters::CreateFromMeshDensity(&local_f0,normalized_mesh_density);
            TVar1 = ON_MeshParameters::GeometrySettingsType(&local_f0);
            if (TVar1 != FromMeshDensity) {
              sFormat = 
              "ON_MeshParameters::ON_MeshParameters::CreateFromMeshDensity(...).GeometrySettingsType() returned an unexpected value."
              ;
              line_number = 0x4ed;
              goto LAB_005bda8d;
            }
            dVar3 = ON_MeshParameters::MeshDensity(&local_f0);
            if ((normalized_mesh_density != dVar3) || (NAN(normalized_mesh_density) || NAN(dVar3)))
            break;
            normalized_mesh_density = normalized_mesh_density + 0.125;
            bVar2 = 1.0 < normalized_mesh_density;
            if (bVar2) {
              return bVar2;
            }
          }
          sFormat = 
          "ON_MeshParameters::ON_MeshParameters::CreateFromMeshDensity(...).MeshDensity() returned an unexpected value."
          ;
          line_number = 0x4f2;
        }
        else {
          sFormat = 
          "ON_MeshParameters::DefaultAnalysisMesh.GeometrySettingsType() returned an unexpected value."
          ;
          bVar2 = false;
          line_number = 0x4e5;
        }
      }
      else {
        sFormat = 
        "ON_MeshParameters::QualityRenderMesh.GeometrySettingsType() returned an unexpected value.";
        bVar2 = false;
        line_number = 0x4e0;
      }
    }
    else {
      sFormat = 
      "ON_MeshParameters::FastRenderMesh.GeometrySettingsType() returned an unexpected value.";
      bVar2 = false;
      line_number = 0x4db;
    }
  }
  else {
    sFormat = "ON_MeshParameters::DefaultMesh.GeometrySettingsType() returned an unexpected value.";
    bVar2 = false;
    line_number = 0x4d6;
  }
LAB_005bda8d:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_statics.cpp"
             ,line_number,"",sFormat);
  return bVar2;
}

Assistant:

bool ON_MeshParameters_AreValid()
{
  // This is a validation test to insure the code that sets default mesh parameters
  // and the code that detects default mesh parameters works correctly.
  // This validation test passes as of November 2020. If ON_ERROR() is called in this function
  // it means new bugs have been introduced. These need to be fixed immediately in order to
  // keep the code that generates display meshes working properly.
  if (ON_MeshParameters::Type::Default != ON_MeshParameters::DefaultMesh.GeometrySettingsType())
  {
    ON_ERROR("ON_MeshParameters::DefaultMesh.GeometrySettingsType() returned an unexpected value.");
    return false;
  }
  if (ON_MeshParameters::Type::FastRender != ON_MeshParameters::FastRenderMesh.GeometrySettingsType())
  {
    ON_ERROR("ON_MeshParameters::FastRenderMesh.GeometrySettingsType() returned an unexpected value.");
    return false;
  }
  if (ON_MeshParameters::Type::QualityRender != ON_MeshParameters::QualityRenderMesh.GeometrySettingsType())
  {
    ON_ERROR("ON_MeshParameters::QualityRenderMesh.GeometrySettingsType() returned an unexpected value.");
    return false;
  }
  if (ON_MeshParameters::Type::DefaultAnalysis != ON_MeshParameters::DefaultAnalysisMesh.GeometrySettingsType())
  {
    ON_ERROR("ON_MeshParameters::DefaultAnalysisMesh.GeometrySettingsType() returned an unexpected value.");
    return false;
  }
  for (double normalized_mesh_density = 0.0; normalized_mesh_density <= 1.0; normalized_mesh_density += 0.125)
  {
    const ON_MeshParameters mp = ON_MeshParameters::CreateFromMeshDensity(normalized_mesh_density);
    if (ON_MeshParameters::Type::FromMeshDensity != mp.GeometrySettingsType())
    {
      ON_ERROR("ON_MeshParameters::ON_MeshParameters::CreateFromMeshDensity(...).GeometrySettingsType() returned an unexpected value.");
      return false;
    }
    if (normalized_mesh_density != mp.MeshDensity())
    {
      ON_ERROR("ON_MeshParameters::ON_MeshParameters::CreateFromMeshDensity(...).MeshDensity() returned an unexpected value.");
      return false;
    }
  }
  return true;
}